

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

void __thiscall
QFusionStyle::drawItemText
          (QFusionStyle *this,QPainter *painter,QRect *rect,int alignment,QPalette *pal,bool enabled
          ,QString *text,ColorRole textRole)

{
  QPen *pQVar1;
  QBrush *pQVar2;
  long in_FS_OFFSET;
  double dVar3;
  QPen aQStack_48 [8];
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size != 0) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (QPen *)QPainter::pen();
    QPen::QPen((QPen *)&local_40,pQVar1);
    if (textRole != NoRole) {
      pQVar2 = (QBrush *)QPalette::brush((ColorGroup)pal,Dark);
      dVar3 = (double)QPen::widthF();
      QPen::QPen(aQStack_48,pQVar2,dVar3,SolidLine,SquareCap,BevelJoin);
      QPainter::setPen((QPen *)painter);
      QPen::~QPen(aQStack_48);
    }
    QPainter::drawText((QRect *)painter,(int)rect,(QString *)(ulong)(uint)alignment,(QRect *)text);
    QPainter::setPen((QPen *)painter);
    QPen::~QPen((QPen *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFusionStyle::drawItemText(QPainter *painter, const QRect &rect, int alignment, const QPalette &pal,
                                bool enabled, const QString& text, QPalette::ColorRole textRole) const
{
    Q_UNUSED(enabled);
    if (text.isEmpty())
        return;

    QPen savedPen = painter->pen();
    if (textRole != QPalette::NoRole)
        painter->setPen(QPen(pal.brush(textRole), savedPen.widthF()));
    painter->drawText(rect, alignment, text);
    painter->setPen(savedPen);
}